

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

void phyr::sortSampleSpace(double *lambda,double *v,int n)

{
  __normal_iterator<std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  __first;
  reference pvVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  pair<double,_double> pVar2;
  int i_1;
  int i;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> data;
  value_type *in_stack_ffffffffffffff68;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *this;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  undefined1 *__n;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  int local_48;
  undefined1 local_31;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_30;
  int local_14;
  long local_10;
  long local_8;
  
  __first._M_current = (pair<double,_double> *)(long)in_EDX;
  __n = &local_31;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<std::pair<double,_double>_>::allocator
            ((allocator<std::pair<double,_double>_> *)0x17df9a);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(size_type)__n,
             (allocator_type *)__first._M_current);
  std::allocator<std::pair<double,_double>_>::~allocator
            ((allocator<std::pair<double,_double>_> *)0x17dfba);
  pVar2.second = in_stack_ffffffffffffff70;
  pVar2.first = in_stack_ffffffffffffff78;
  for (local_48 = 0; local_48 < local_14; local_48 = local_48 + 1) {
    pVar2 = std::make_pair<double&,double&>
                      ((double *)pVar2.second,&in_stack_ffffffffffffff68->first);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::push_back
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               pVar2.second,in_stack_ffffffffffffff68);
  }
  this = &local_30;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::begin(this);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::end(this);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<double,double>*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>
            (__first,(pair<double,_double> *)pVar2.first);
  for (iVar3 = 0; iVar3 < local_14; iVar3 = iVar3 + 1) {
    pvVar1 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](&local_30,(long)iVar3);
    *(double *)(local_8 + (long)iVar3 * 8) = pvVar1->first;
    pvVar1 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[](&local_30,(long)iVar3);
    *(double *)(local_10 + (long)iVar3 * 8) = pvVar1->second;
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             __first._M_current);
  return;
}

Assistant:

void sortSampleSpace(Real* lambda, Real* v, int n) {
    std::vector<std::pair<Real, Real>> data(n);

    // Populate data
    for (int i = 0; i < n; i++)
        data.push_back(std::make_pair(lambda[i], v[i]));
    std::sort(data.begin(), data.end());

    // Restore sorted data
    for (int i = 0; i < n; i++) {
        lambda[i] = data[i].first;
        v[i] = data[i].second;
    }
}